

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O1

int poptReadConfigFile(poptContext con,char *fn)

{
  byte bVar1;
  ushort *puVar2;
  size_t sVar3;
  byte *pbVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  byte *__pattern;
  ushort **ppuVar9;
  char *pcVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  byte *pbVar18;
  byte *fn_00;
  byte *pbVar19;
  bool bVar20;
  char *b_1;
  size_t nb_1;
  char *b;
  size_t nb;
  byte *local_b8;
  char **local_b0;
  size_t local_a8;
  poptContext local_a0;
  byte *local_98;
  byte *local_90;
  poptItem_s local_88;
  ulong local_48;
  byte *local_40;
  size_t local_38;
  
  local_90 = (byte *)0x0;
  local_38 = 0;
  iVar6 = poptReadFile(fn,(char **)&local_90,&local_38,1);
  sVar3 = local_38;
  pbVar19 = local_90;
  if (iVar6 != 0) {
    piVar8 = __errno_location();
    if (*piVar8 != 2) {
      return iVar6;
    }
    return 0;
  }
  iVar6 = 0;
  if (local_38 == 0 || local_90 == (byte *)0x0) {
    iVar15 = -0x16;
  }
  else {
    __pattern = (byte *)malloc(local_38 + 1);
    iVar15 = 0;
    if (__pattern != (byte *)0x0) {
      pbVar12 = __pattern;
      if (0 < (long)sVar3) {
        pbVar13 = pbVar19 + sVar3;
        local_40 = __pattern + 1;
        local_a0 = con;
        local_98 = __pattern;
        do {
          bVar5 = *pbVar19;
          if (bVar5 == 0x5c) {
            pbVar19 = pbVar19 + 1;
            *__pattern = 0x5c;
            if ((pbVar19 < pbVar13) && (*pbVar19 != 10)) {
              __pattern[1] = *pbVar19;
              __pattern = __pattern + 2;
            }
          }
          else if (bVar5 == 10) {
            *__pattern = 0;
            uVar11 = (ulong)*pbVar12;
            bVar20 = uVar11 == 0;
            __pattern = pbVar12;
            if (!bVar20) {
              ppuVar9 = __ctype_b_loc();
              bVar5 = *(byte *)((long)*ppuVar9 + uVar11 * 2 + 1);
              pbVar18 = local_40;
              while ((bVar5 & 0x20) != 0) {
                uVar11 = (ulong)*pbVar18;
                bVar20 = uVar11 == 0;
                __pattern = pbVar18;
                if (bVar20) break;
                pbVar18 = pbVar18 + 1;
                bVar5 = *(byte *)((long)*ppuVar9 + uVar11 * 2 + 1);
              }
            }
            if (((char)uVar11 != '\0') && (pbVar12 = local_98, (int)uVar11 != 0x23)) {
              local_b8 = (byte *)0x0;
              local_a8 = 0;
              pcVar10 = local_a0->appName;
              if (pcVar10 != (char *)0x0) {
                local_88.argc = 0;
                local_88._52_4_ = 0;
                local_88.argv = (char **)0x0;
                local_88.option.descrip = (char *)0x0;
                local_88.option.argDescrip = (char *)0x0;
                local_88.option.arg = (void *)0x0;
                local_88.option.val = 0;
                local_88.option._28_4_ = 0;
                local_88.option.longName = (char *)0x0;
                local_88.option.shortName = '\0';
                local_88.option._9_3_ = 0;
                local_88.option.argInfo = 0;
                if (!bVar20) {
                  ppuVar9 = __ctype_b_loc();
                  pbVar18 = __pattern;
                  if ((*(byte *)((long)*ppuVar9 + uVar11 * 2 + 1) & 0x20) == 0) {
                    do {
                      pbVar12 = pbVar18 + 1;
                      bVar20 = (ulong)*pbVar12 == 0;
                      if (bVar20) goto LAB_00105a9d;
                      pbVar18 = pbVar18 + 1;
                    } while ((*(byte *)((long)*ppuVar9 + (ulong)*pbVar12 * 2 + 1) & 0x20) == 0);
                  }
                  else {
                    bVar20 = false;
                  }
                  if (!bVar20) {
                    *pbVar18 = 0;
                    iVar6 = glob_pattern_p((char *)__pattern,1);
                    if (iVar6 == 0) {
                      iVar6 = strcmp((char *)__pattern,pcVar10);
                    }
                    else {
                      iVar6 = fnmatch((char *)__pattern,pcVar10,5);
                    }
                    if (iVar6 == 0) {
                      pbVar12 = pbVar18 + 2;
                      do {
                        pbVar14 = pbVar12;
                        pbVar18 = pbVar18 + 1;
                        uVar11 = (ulong)*pbVar18;
                        fn_00 = pbVar18;
                        if (uVar11 == 0) goto LAB_00105b2a;
                        pbVar12 = pbVar14 + 1;
                      } while ((*(byte *)((long)*ppuVar9 + uVar11 * 2 + 1) & 0x20) != 0);
                      if (uVar11 != 0) {
                        if ((*(byte *)((long)*ppuVar9 + uVar11 * 2 + 1) & 0x20) == 0) {
                          do {
                            fn_00 = pbVar14;
                            bVar20 = (ulong)*fn_00 == 0;
                            if (bVar20) goto LAB_00105b2a;
                            pbVar14 = fn_00 + 1;
                          } while ((*(byte *)((long)*ppuVar9 + (ulong)*fn_00 * 2 + 1) & 0x20) == 0);
                        }
                        else {
                          bVar20 = false;
                        }
                        if (!bVar20) {
                          *fn_00 = 0;
                          fn_00 = fn_00 + 1;
                        }
                      }
LAB_00105b2a:
                      bVar5 = *fn_00;
                      if ((ulong)bVar5 != 0) {
                        puVar2 = *ppuVar9;
                        if ((*(byte *)((long)puVar2 + (ulong)bVar5 * 2 + 1) & 0x20) == 0) {
                          bVar20 = false;
                        }
                        else {
                          do {
                            bVar5 = fn_00[1];
                            bVar20 = (ulong)bVar5 == 0;
                            if (bVar20) goto LAB_00105a9d;
                            fn_00 = fn_00 + 1;
                          } while ((*(byte *)((long)puVar2 + (ulong)bVar5 * 2 + 1) & 0x20) != 0);
                        }
                        if (!bVar20) {
                          bVar20 = (ulong)*fn_00 != 0;
                          pbVar14 = fn_00;
                          if (bVar20) {
                            bVar20 = true;
                            bVar1 = *(byte *)((long)puVar2 + (ulong)*fn_00 * 2 + 1);
                            while ((bVar1 & 0x20) == 0) {
                              pbVar14 = pbVar14 + 1;
                              uVar11 = (ulong)*pbVar14;
                              bVar20 = uVar11 != 0;
                              if (uVar11 == 0) break;
                              bVar1 = *(byte *)((long)puVar2 + uVar11 * 2 + 1);
                            }
                          }
                          if ((bVar5 != 0x2d) || (bVar20)) {
                            if (bVar20) {
                              *pbVar14 = 0;
                              pbVar14 = pbVar14 + 1;
                            }
                            bVar20 = (ulong)*pbVar14 != 0;
                            if (bVar20) {
                              bVar20 = true;
                              bVar5 = *(byte *)((long)*ppuVar9 + (ulong)*pbVar14 * 2 + 1);
                              while ((bVar5 & 0x20) != 0) {
                                pbVar14 = pbVar14 + 1;
                                uVar11 = (ulong)*pbVar14;
                                bVar20 = uVar11 != 0;
                                if (uVar11 == 0) break;
                                bVar5 = *(byte *)((long)*ppuVar9 + uVar11 * 2 + 1);
                              }
                            }
                            if ((bVar20) || (*fn_00 != 0x2d)) {
                              if (*fn_00 == 0x2d) {
                                pbVar4 = fn_00 + 2;
                                if (fn_00[1] != 0x2d) {
                                  if (fn_00[2] != 0) goto LAB_00105c46;
                                  local_88.option.shortName = fn_00[1];
                                  pbVar4 = (byte *)local_88.option.longName;
                                }
                              }
                              else {
LAB_00105c46:
                                iVar6 = poptReadFile((char *)fn_00,(char **)&local_b8,&local_a8,1);
                                sVar3 = local_a8;
                                pbVar12 = local_b8;
                                bVar20 = true;
                                if ((iVar6 == 0) && (local_a8 != 0 && local_b8 != (byte *)0x0)) {
                                  if (*pbVar14 != 0) {
                                    local_b0 = (char **)strlen((char *)pbVar14);
                                    local_b8 = (byte *)realloc(pbVar12,(long)local_b0 + sVar3 + 1);
                                    sVar3 = local_a8;
                                    bVar20 = local_b8 == (byte *)0x0;
                                    if (bVar20) goto LAB_00105c6c;
                                    local_b0 = (char **)((long)local_b0 + 1);
                                    (local_b8 + (local_a8 - 1))[0] = 0x20;
                                    (local_b8 + (local_a8 - 1))[1] = 0;
                                    strcpy((char *)(local_b8 + local_a8),(char *)pbVar14);
                                    local_a8 = (long)local_b0 + sVar3;
                                  }
                                  pbVar14 = local_b8;
                                  pcVar10 = strrchr((char *)fn_00,0x2f);
                                  pbVar12 = (byte *)(pcVar10 + 1);
                                  if (pcVar10 == (char *)0x0) {
                                    pbVar12 = fn_00;
                                  }
                                  if (pbVar12[1] == 0) {
                                    local_88.option.shortName = *pbVar12;
                                    pbVar12 = (byte *)local_88.option.longName;
                                  }
                                  local_88.option.longName = (char *)pbVar12;
                                  bVar20 = false;
                                }
LAB_00105c6c:
                                if (bVar20) goto LAB_00105a9d;
                                pbVar12 = local_98;
                                pbVar4 = (byte *)local_88.option.longName;
                                if (bVar20) goto LAB_00105ab1;
                              }
                              local_88.option.longName = (char *)pbVar4;
                              iVar6 = poptParseArgvString((char *)pbVar14,&local_88.argc,
                                                          &local_88.argv);
                              if (iVar6 == 0) {
                                local_88.option.argInfo = 0x40000000;
                                local_48 = (ulong)local_88.argc;
                                if ((long)local_48 < 1) {
                                  uVar11 = 0;
                                  uVar16 = 0;
                                }
                                else {
                                  uVar7 = 0;
                                  uVar11 = 0;
                                  uVar17 = 0;
                                  do {
                                    local_b0 = local_88.argv;
                                    pcVar10 = local_88.argv[uVar11];
                                    iVar6 = strncmp(pcVar10,"--POPTdesc=",0xb);
                                    iVar15 = (int)uVar17;
                                    if (iVar6 == 0) {
                                      local_88.option.descrip = pcVar10 + 0xc;
                                      if ((pcVar10[0xc] == '$') && (pcVar10[0xd] == '\"')) {
                                        local_88.option.descrip = pcVar10 + 0xd;
                                      }
                                      uVar7 = uVar7 & 0xbfffffff;
LAB_00105e18:
                                      local_88.option.argInfo = uVar7;
                                      iVar15 = iVar15 + -1;
                                    }
                                    else {
                                      iVar6 = strncmp(pcVar10,"--POPTargs=",0xb);
                                      if (iVar6 == 0) {
                                        local_88.option.argDescrip = pcVar10 + 0xc;
                                        if ((pcVar10[0xc] == '$') && (pcVar10[0xd] == '\"')) {
                                          local_88.option.argDescrip = pcVar10 + 0xd;
                                        }
                                        uVar7 = (uVar7 & 0xbffffffe) + 1;
                                        goto LAB_00105e18;
                                      }
                                      if (uVar11 != uVar17) {
                                        local_b0[iVar15] = pcVar10;
                                      }
                                    }
                                    uVar11 = uVar11 + 1;
                                    uVar16 = iVar15 + 1;
                                    uVar17 = (ulong)uVar16;
                                  } while (local_48 != uVar11);
                                }
                                if (uVar16 != (uint)uVar11) {
                                  local_88.argv[(int)uVar16] = (char *)0x0;
                                  local_88.argc = uVar16;
                                }
                                iVar6 = strcmp((char *)pbVar18,"alias");
                                if (iVar6 == 0) {
                                  iVar6 = 0;
                                }
                                else {
                                  iVar6 = strcmp((char *)pbVar18,"exec");
                                  if (iVar6 != 0) goto LAB_00105a9d;
                                  iVar6 = 1;
                                }
                                poptAddItem(local_a0,&local_88,iVar6);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
LAB_00105a9d:
              pbVar12 = local_98;
              if (local_b8 != (byte *)0x0) {
                free(local_b8);
                pbVar12 = local_98;
              }
            }
          }
          else {
            *__pattern = bVar5;
            __pattern = __pattern + 1;
          }
LAB_00105ab1:
          pbVar19 = pbVar19 + 1;
        } while (pbVar19 < pbVar13);
        iVar6 = 0;
      }
      goto LAB_00105ef1;
    }
  }
  iVar6 = iVar15;
  pbVar12 = (byte *)0x0;
LAB_00105ef1:
  free(pbVar12);
  if (local_90 != (byte *)0x0) {
    free(local_90);
  }
  return iVar6;
}

Assistant:

int poptReadConfigFile(poptContext con, const char * fn)
{
    char * b = NULL, *be;
    size_t nb = 0;
    const char *se;
    char *t = NULL, *te;
    int rc;

    if ((rc = poptReadFile(fn, &b, &nb, POPT_READFILE_TRIMNEWLINES)) != 0)
	return (errno == ENOENT ? 0 : rc);
    if (b == NULL || nb == 0) {
	rc = POPT_ERROR_BADCONFIG;
	goto exit;
    }

    if ((t = malloc(nb + 1)) == NULL)
	goto exit;
    te = t;

    be = (b + nb);
    for (se = b; se < be; se++) {
	switch (*se) {
	  case '\n':
	    *te = '\0';
	    te = t;
	    while (*te && _isspaceptr(te)) te++;
	    if (*te && *te != '#')
		if ((rc = poptConfigLine(con, te)) != 0)
		    goto exit;
	    break;
	  case '\\':
	    *te = *se++;
	    /* \ at the end of a line does not insert a \n */
	    if (se < be && *se != '\n') {
		te++;
		*te++ = *se;
	    }
	    break;
	  default:
	    *te++ = *se;
	    break;
	}
    }
    rc = 0;

exit:
    free(t);
    if (b)
	free(b);
    return rc;
}